

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_write_to_buf(gguf_context *ctx,vector<signed_char,_std::allocator<signed_char>_> *buf,
                      bool only_meta)

{
  gguf_tensor_info *info;
  size_t offset_data_00;
  const_reference pvVar1;
  size_t in_RCX;
  byte in_DL;
  void *__buf;
  vector<signed_char,_std::allocator<signed_char>_> *in_RSI;
  long in_RDI;
  int64_t i_2;
  size_t offset_data;
  int64_t i_1;
  int64_t i;
  int64_t n_tensors;
  int64_t n_kv;
  gguf_writer gw;
  size_type local_50;
  gguf_tensor_info *in_stack_ffffffffffffffb8;
  gguf_writer *in_stack_ffffffffffffffc0;
  gguf_writer *this;
  size_type alignment;
  gguf_writer in_stack_ffffffffffffffe0;
  
  gguf_writer::gguf_writer((gguf_writer *)&stack0xffffffffffffffe0,in_RSI);
  info = (gguf_tensor_info *)gguf_get_n_kv((gguf_context *)0x191f7f);
  offset_data_00 = gguf_get_n_tensors((gguf_context *)0x191f8e);
  gguf_writer::write<char>(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  gguf_writer::write<char>(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  gguf_writer::write<char>(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  gguf_writer::write<char>(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  gguf_writer::write<unsigned_int>(in_stack_ffffffffffffffc0,(uint *)in_stack_ffffffffffffffb8);
  gguf_writer::write<long>(in_stack_ffffffffffffffc0,(long *)in_stack_ffffffffffffffb8);
  gguf_writer::write<long>(in_stack_ffffffffffffffc0,(long *)in_stack_ffffffffffffffb8);
  for (alignment = 0; (long)alignment < (long)info; alignment = alignment + 1) {
    pvVar1 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                       ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),alignment);
    gguf_writer::write((gguf_writer *)&stack0xffffffffffffffe0,(int)pvVar1,__buf,in_RCX);
  }
  for (this = (gguf_writer *)0x0; (long)this < (long)offset_data_00;
      this = (gguf_writer *)((long)&this->buf + 1)) {
    std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::operator[]
              ((vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *)(in_RDI + 0x20),
               (size_type)this);
    gguf_writer::write_tensor_meta(this,in_stack_ffffffffffffffb8);
  }
  gguf_writer::pad(this,(size_t)in_stack_ffffffffffffffb8);
  if ((in_DL & 1) == 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::size(in_stack_ffffffffffffffe0.buf);
    for (local_50 = 0; (long)local_50 < (long)offset_data_00; local_50 = local_50 + 1) {
      std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::operator[]
                ((vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *)(in_RDI + 0x20),
                 local_50);
      gguf_writer::write_tensor_data
                ((gguf_writer *)in_stack_ffffffffffffffe0.buf,info,offset_data_00,alignment);
    }
  }
  return;
}

Assistant:

void gguf_write_to_buf(const struct gguf_context * ctx, std::vector<int8_t> & buf, bool only_meta) {
    const struct gguf_writer gw(buf);

    const int64_t n_kv      = gguf_get_n_kv(ctx);
    const int64_t n_tensors = gguf_get_n_tensors(ctx);

    // write header
    gw.write(GGUF_MAGIC[0]);
    gw.write(GGUF_MAGIC[1]);
    gw.write(GGUF_MAGIC[2]);
    gw.write(GGUF_MAGIC[3]);
    gw.write(ctx->version);
    gw.write(n_tensors);
    gw.write(n_kv);

    // write key-value pairs
    for (int64_t i = 0; i < n_kv; ++i) {
        gw.write(ctx->kv[i]);
    }

    // write tensor info
    for (int64_t i = 0; i < n_tensors; ++i) {
        gw.write_tensor_meta(ctx->info[i]);
    }

    // we require the data section to be aligned
    gw.pad(ctx->alignment);

    if (only_meta) {
        return;
    }

    const size_t offset_data = gw.buf.size();

    // write tensor data
    for (int64_t i = 0; i < n_tensors; ++i) {
        gw.write_tensor_data(ctx->info[i], offset_data, ctx->alignment);
    }
}